

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_sbar.cpp
# Opt level: O0

void ST_LoadCrosshair(bool alwaysload)

{
  bool bVar1;
  int iVar2;
  AActor *pAVar3;
  char local_3d;
  FTextureID local_30;
  char local_29;
  FTextureID texid;
  char size;
  char name [16];
  uint local_10;
  int num;
  bool alwaysload_local;
  
  local_10 = 0;
  bVar1 = FBoolCVar::operator_cast_to_bool(&crosshairforce);
  if ((((!bVar1) &&
       (bVar1 = TObjPtr<AActor>::operator!=
                          ((TObjPtr<AActor> *)(&DAT_01ae7238 + (long)consoleplayer * 0x2a0),
                           (AActor *)0x0), bVar1)) &&
      (pAVar3 = TObjPtr<AActor>::operator->
                          ((TObjPtr<AActor> *)(&DAT_01ae7238 + (long)consoleplayer * 0x2a0)),
      pAVar3->player != (player_t *)0x0)) &&
     (pAVar3 = TObjPtr<AActor>::operator->
                         ((TObjPtr<AActor> *)(&DAT_01ae7238 + (long)consoleplayer * 0x2a0)),
     pAVar3->player->ReadyWeapon != (AWeapon *)0x0)) {
    pAVar3 = TObjPtr<AActor>::operator->
                       ((TObjPtr<AActor> *)(&DAT_01ae7238 + (long)consoleplayer * 0x2a0));
    local_10 = pAVar3->player->ReadyWeapon->Crosshair;
  }
  if (local_10 == 0) {
    local_10 = FIntCVar::operator_cast_to_int(&crosshair);
  }
  if (((alwaysload) || (CrosshairNum != local_10)) || (CrosshairImage == (FTexture *)0x0)) {
    if (CrosshairImage != (FTexture *)0x0) {
      (*CrosshairImage->_vptr_FTexture[9])();
    }
    if (local_10 == 0) {
      CrosshairNum = 0;
      CrosshairImage = (FTexture *)0x0;
    }
    else {
      if ((int)local_10 < 0) {
        local_10 = -local_10;
      }
      iVar2 = DCanvas::GetWidth((DCanvas *)screen);
      local_3d = 'S';
      if (0x27f < iVar2) {
        local_3d = 'B';
      }
      local_29 = local_3d;
      mysnprintf((char *)&texid,0x10,"XHAIR%c%d",(ulong)(uint)(int)local_3d,(ulong)local_10);
      local_30 = FTextureManager::CheckForTexture(&TexMan,(char *)&texid,8,0x11);
      bVar1 = FTextureID::isValid(&local_30);
      if (!bVar1) {
        mysnprintf((char *)&texid,0x10,"XHAIR%c1",(ulong)(uint)(int)local_29);
        local_30 = FTextureManager::CheckForTexture(&TexMan,(char *)&texid,8,0x11);
        bVar1 = FTextureID::isValid(&local_30);
        if (!bVar1) {
          local_30 = FTextureManager::CheckForTexture(&TexMan,"XHAIRS1",8,0x11);
        }
      }
      CrosshairNum = local_10;
      CrosshairImage = FTextureManager::operator[](&TexMan,local_30);
    }
  }
  return;
}

Assistant:

void ST_LoadCrosshair(bool alwaysload)
{
	int num = 0;
	char name[16], size;

	if (!crosshairforce &&
		players[consoleplayer].camera != NULL &&
		players[consoleplayer].camera->player != NULL &&
		players[consoleplayer].camera->player->ReadyWeapon != NULL)
	{
		num = players[consoleplayer].camera->player->ReadyWeapon->Crosshair;
	}
	if (num == 0)
	{
		num = crosshair;
	}
	if (!alwaysload && CrosshairNum == num && CrosshairImage != NULL)
	{ // No change.
		return;
	}

	if (CrosshairImage != NULL)
	{
		CrosshairImage->Unload ();
	}
	if (num == 0)
	{
		CrosshairNum = 0;
		CrosshairImage = NULL;
		return;
	}
	if (num < 0)
	{
		num = -num;
	}
	size = (SCREENWIDTH < 640) ? 'S' : 'B';

	mysnprintf (name, countof(name), "XHAIR%c%d", size, num);
	FTextureID texid = TexMan.CheckForTexture(name, FTexture::TEX_MiscPatch, FTextureManager::TEXMAN_TryAny | FTextureManager::TEXMAN_ShortNameOnly);
	if (!texid.isValid())
	{
		mysnprintf (name, countof(name), "XHAIR%c1", size);
		texid = TexMan.CheckForTexture(name, FTexture::TEX_MiscPatch, FTextureManager::TEXMAN_TryAny | FTextureManager::TEXMAN_ShortNameOnly);
		if (!texid.isValid())
		{
			texid = TexMan.CheckForTexture("XHAIRS1", FTexture::TEX_MiscPatch, FTextureManager::TEXMAN_TryAny | FTextureManager::TEXMAN_ShortNameOnly);
		}
	}
	CrosshairNum = num;
	CrosshairImage = TexMan[texid];
}